

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint errorCode;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  size_t sStackY_90;
  PaStream *stream;
  paTestData data;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  puts("patest_record.c");
  fflush(_stdout);
  data.frameIndex = 0;
  data.maxFrameIndex = 0x35d54;
  data.recordedSamples = (SAMPLE *)malloc(0x1aeaa0);
  if (data.recordedSamples == (SAMPLE *)0x0) {
    puts("Could not allocate record array.");
  }
  else {
    for (lVar3 = 0; lVar3 != 0x6baa8; lVar3 = lVar3 + 1) {
      data.recordedSamples[lVar3] = 0.0;
    }
    errorCode = Pa_Initialize();
    if (errorCode != 0) goto LAB_00106b3e;
    inputParameters.device = Pa_GetDefaultInputDevice();
    if (inputParameters.device == -1) {
      pcVar2 = "Error: No default input device.\n";
      sStackY_90 = 0x20;
    }
    else {
      inputParameters.channelCount = 2;
      inputParameters.sampleFormat = 1;
      pPVar1 = Pa_GetDeviceInfo(inputParameters.device);
      inputParameters.suggestedLatency = pPVar1->defaultLowInputLatency;
      inputParameters.hostApiSpecificStreamInfo = (void *)0x0;
      errorCode = Pa_OpenStream(&stream,&inputParameters,(PaStreamParameters *)0x0,44100.0,0x200,1,
                                recordCallback,&data);
      if ((errorCode != 0) || (errorCode = Pa_StartStream(stream), errorCode != 0))
      goto LAB_00106b3e;
      puts("\n=== Now recording!! Please speak into the microphone. ===");
      while( true ) {
        fflush(_stdout);
        errorCode = Pa_IsStreamActive(stream);
        if (errorCode != 1) break;
        Pa_Sleep(1000);
        printf("index = %d\n");
      }
      if (((int)errorCode < 0) || (errorCode = Pa_CloseStream(stream), errorCode != 0))
      goto LAB_00106b3e;
      dVar7 = 0.0;
      fVar4 = 0.0;
      for (lVar3 = 0; lVar3 != 0x6baa8; lVar3 = lVar3 + 1) {
        fVar6 = data.recordedSamples[lVar3];
        fVar5 = -fVar6;
        if (-fVar6 <= fVar6) {
          fVar5 = fVar6;
        }
        fVar6 = fVar5;
        if (fVar5 <= fVar4) {
          fVar6 = fVar4;
        }
        dVar7 = dVar7 + (double)fVar5;
        fVar4 = fVar6;
      }
      printf("sample max amplitude = %.8f\n",(double)fVar4);
      printf("sample average = %lf\n",dVar7 / 441000.0);
      data._0_8_ = data._0_8_ & 0xffffffff00000000;
      outputParameters.device = Pa_GetDefaultOutputDevice();
      if (outputParameters.device != -1) {
        outputParameters.channelCount = 2;
        outputParameters.sampleFormat = 1;
        pPVar1 = Pa_GetDeviceInfo(outputParameters.device);
        outputParameters.suggestedLatency = pPVar1->defaultLowOutputLatency;
        outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
        puts("\n=== Now playing back. ===");
        fflush(_stdout);
        errorCode = Pa_OpenStream(&stream,(PaStreamParameters *)0x0,&outputParameters,44100.0,0x200,
                                  1,playCallback,&data);
        if ((stream == (PaStream *)0x0 || errorCode != 0) ||
           (errorCode = Pa_StartStream(stream), errorCode != 0)) goto LAB_00106b3e;
        puts("Waiting for playback to finish.");
        fflush(_stdout);
        while (errorCode = Pa_IsStreamActive(stream), errorCode == 1) {
          Pa_Sleep(100);
        }
        if (((int)errorCode < 0) || (errorCode = Pa_CloseStream(stream), errorCode != 0))
        goto LAB_00106b3e;
        puts("Done.");
        fflush(_stdout);
        goto LAB_00106b3c;
      }
      pcVar2 = "Error: No default output device.\n";
      sStackY_90 = 0x21;
    }
    fwrite(pcVar2,sStackY_90,1,_stderr);
  }
LAB_00106b3c:
  errorCode = 0;
LAB_00106b3e:
  Pa_Terminate();
  free(data.recordedSamples);
  if (errorCode != 0) {
    fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
    fprintf(_stderr,"Error number: %d\n",(ulong)errorCode);
    __stream = _stderr;
    pcVar2 = Pa_GetErrorText(errorCode);
    fprintf(__stream,"Error message: %s\n",pcVar2);
  }
  return (uint)(errorCode != 0);
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data;
    int                 i;
    int                 totalFrames;
    int                 numSamples;
    int                 numBytes;
    SAMPLE              max, val;
    double              average;

    printf("patest_record.c\n"); fflush(stdout);

    data.maxFrameIndex = totalFrames = NUM_SECONDS * SAMPLE_RATE; /* Record for a few seconds. */
    data.frameIndex = 0;
    numSamples = totalFrames * NUM_CHANNELS;
    numBytes = numSamples * sizeof(SAMPLE);
    data.recordedSamples = (SAMPLE *) malloc( numBytes ); /* From now on, recordedSamples is initialised. */
    if( data.recordedSamples == NULL )
    {
        printf("Could not allocate record array.\n");
        goto done;
    }
    for( i=0; i<numSamples; i++ ) data.recordedSamples[i] = 0;

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording!! Please speak into the microphone. ===\n"); fflush(stdout);

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 )
    {
        Pa_Sleep(1000);
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Measure maximum peak amplitude. */
    max = 0;
    average = 0.0;
    for( i=0; i<numSamples; i++ )
    {
        val = data.recordedSamples[i];
        if( val < 0 ) val = -val; /* ABS */
        if( val > max )
        {
            max = val;
        }
        average += val;
    }

    average = average / (double)numSamples;

    printf("sample max amplitude = "PRINTF_S_FORMAT"\n", max );
    printf("sample average = %lf\n", average );

    /* Write recorded data to a file. */
#if WRITE_TO_FILE
    {
        FILE  *fid;
        fid = fopen("recorded.raw", "wb");
        if( fid == NULL )
        {
            printf("Could not open file.");
        }
        else
        {
            fwrite( data.recordedSamples, NUM_CHANNELS * sizeof(SAMPLE), totalFrames, fid );
            fclose( fid );
            printf("Wrote data to 'recorded.raw'\n");
        }
    }
#endif

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back. ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Waiting for playback to finish.\n"); fflush(stdout);

        while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
        if( err < 0 ) goto done;
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.recordedSamples )       /* Sure it is NULL or valid. */
        free( data.recordedSamples );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}